

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O0

void reportOption(FILE *file,HighsLogOptions *log_options,OptionRecordBool *option,
                 bool report_only_deviations,HighsFileType file_type)

{
  FILE *__stream;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte in_CL;
  long in_RDX;
  HighsLogOptions *in_RSI;
  FILE *in_RDI;
  int in_R8D;
  string line;
  string *in_stack_fffffffffffffe68;
  string local_170 [8];
  HighsInt in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [48];
  string local_60 [32];
  string local_40 [39];
  byte local_19;
  long local_18;
  HighsLogOptions *local_10;
  FILE *local_8;
  
  local_19 = in_CL & 1;
  if ((local_19 == 0) || ((*(byte *)(in_RDX + 0x60) & 1) != (**(byte **)(in_RDX + 0x58) & 1))) {
    if (in_R8D == 4) {
      local_18 = in_RDX;
      std::__cxx11::string::string(local_60,(string *)(in_RDX + 0x10));
      highsInsertMdEscapes(in_stack_fffffffffffffe68);
      uVar1 = std::__cxx11::string::c_str();
      std::__cxx11::string::string(local_b0,(string *)(local_18 + 0x30));
      highsInsertMdEscapes(in_stack_fffffffffffffe68);
      uVar2 = std::__cxx11::string::c_str();
      highsBoolToString_abi_cxx11_((bool)in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98);
      uVar3 = std::__cxx11::string::c_str();
      fprintf(in_RDI,"## %s\n- %s\n- Type: boolean\n- Default: \"%s\"\n\n",uVar1,uVar2,uVar3);
      std::__cxx11::string::~string(local_d0);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_40);
      std::__cxx11::string::~string(local_60);
    }
    else {
      local_8 = in_RDI;
      if (in_R8D == 1) {
        uVar1 = std::__cxx11::string::c_str();
        fprintf(in_RDI,"\n# %s\n",uVar1);
        __stream = local_8;
        highsBoolToString_abi_cxx11_((bool)in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98);
        uVar1 = std::__cxx11::string::c_str();
        highsBoolToString_abi_cxx11_((bool)in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98);
        uVar2 = std::__cxx11::string::c_str();
        fprintf(__stream,"# [type: bool, advanced: %s, range: {false, true}, default: %s]\n",uVar1,
                uVar2);
        std::__cxx11::string::~string(local_110);
        std::__cxx11::string::~string(local_f0);
        uVar1 = std::__cxx11::string::c_str();
        highsBoolToString_abi_cxx11_((bool)in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98);
        uVar2 = std::__cxx11::string::c_str();
        fprintf(local_8,"%s = %s\n",uVar1,uVar2);
        std::__cxx11::string::~string(local_130);
      }
      else {
        local_10 = in_RSI;
        uVar1 = std::__cxx11::string::c_str();
        highsBoolToString_abi_cxx11_((bool)in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98);
        uVar2 = std::__cxx11::string::c_str();
        highsFormatToString_abi_cxx11_((char *)local_150,"Set option %s to %s\n",uVar1,uVar2);
        std::__cxx11::string::~string(local_170);
        if (local_8 == _stdout) {
          uVar1 = std::__cxx11::string::c_str();
          highsLogUser(local_10,kInfo,"%s",uVar1);
        }
        else {
          uVar1 = std::__cxx11::string::c_str();
          fprintf(local_8,"%s",uVar1);
        }
        std::__cxx11::string::~string(local_150);
      }
    }
  }
  return;
}

Assistant:

void reportOption(FILE* file, const HighsLogOptions& log_options,
                  const OptionRecordBool& option,
                  const bool report_only_deviations,
                  const HighsFileType file_type) {
  if (!report_only_deviations || option.default_value != *option.value) {
    if (file_type == HighsFileType::kMd) {
      fprintf(file, "## %s\n- %s\n- Type: boolean\n- Default: \"%s\"\n\n",
              highsInsertMdEscapes(option.name).c_str(),
              highsInsertMdEscapes(option.description).c_str(),
              highsBoolToString(option.default_value).c_str());
    } else if (file_type == HighsFileType::kFull) {
      fprintf(file, "\n# %s\n", option.description.c_str());
      fprintf(
          file,
          "# [type: bool, advanced: %s, range: {false, true}, default: %s]\n",
          highsBoolToString(option.advanced).c_str(),
          highsBoolToString(option.default_value).c_str());
      fprintf(file, "%s = %s\n", option.name.c_str(),
              highsBoolToString(*option.value).c_str());
    } else {
      std::string line =
          highsFormatToString("Set option %s to %s\n", option.name.c_str(),
                              highsBoolToString(*option.value).c_str());
      if (file == stdout) {
        highsLogUser(log_options, HighsLogType::kInfo, "%s", line.c_str());
      } else {
        fprintf(file, "%s", line.c_str());
      }
    }
  }
}